

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool cmLocalGeneratorShortenObjectName(string *objName,size_type max_len)

{
  long lVar1;
  string local_a8 [48];
  string local_78;
  undefined1 local_58 [8];
  string md5name;
  cmCryptoHash md5;
  size_type pos;
  size_type max_len_local;
  string *objName_local;
  
  std::__cxx11::string::size();
  lVar1 = std::__cxx11::string::find((char)objName,0x2f);
  if (lVar1 != -1) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)((long)&md5name.field_2 + 8),AlgoMD5);
    std::__cxx11::string::substr((ulong)&local_78,(ulong)objName);
    cmCryptoHash::HashString
              ((string *)local_58,(cmCryptoHash *)((long)&md5name.field_2 + 8),&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::substr((ulong)local_a8,(ulong)objName);
    std::__cxx11::string::operator+=((string *)local_58,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::operator=((string *)objName,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)((long)&md5name.field_2 + 8));
  }
  return lVar1 != -1;
}

Assistant:

static bool cmLocalGeneratorShortenObjectName(std::string& objName,
                                              std::string::size_type max_len)
{
  // Replace the beginning of the path portion of the object name with
  // its own md5 sum.
  std::string::size_type pos =
    objName.find('/', objName.size() - max_len + 32);
  if (pos != std::string::npos) {
    cmCryptoHash md5(cmCryptoHash::AlgoMD5);
    std::string md5name = md5.HashString(objName.substr(0, pos));
    md5name += objName.substr(pos);
    objName = md5name;

    // The object name is now short enough.
    return true;
  }
  // The object name could not be shortened enough.
  return false;
}